

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

int8_t __thiscall
icu_63::UnicodeString::caseCompare(UnicodeString *this,UnicodeString *text,uint32_t options)

{
  short sVar1;
  ushort uVar2;
  int8_t iVar3;
  int32_t iVar4;
  char16_t *srcChars;
  int srcStart;
  int srcLength;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar2 & 1) == 0) {
    if ((short)uVar2 < 0) {
      iVar4 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    srcStart = 0;
    if (iVar4 < 0) {
      srcStart = iVar4;
    }
    srcLength = iVar4 - srcStart;
    if (iVar4 <= iVar4 - srcStart) {
      srcLength = iVar4;
    }
    if (iVar4 < 0) {
      srcLength = 0;
    }
    if (sVar1 < 0) {
      iVar4 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if ((uVar2 & 2) == 0) {
      srcChars = (text->fUnion).fFields.fArray;
    }
    else {
      srcChars = (text->fUnion).fStackFields.fBuffer;
    }
    iVar3 = doCaseCompare(this,0,iVar4,srcChars,srcStart,srcLength,options);
    return iVar3;
  }
  return ~(byte)sVar1 & 1;
}

Assistant:

inline int8_t
UnicodeString::caseCompare(const UnicodeString &text, uint32_t options) const {
  return doCaseCompare(0, length(), text, 0, text.length(), options);
}